

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O3

void __thiscall
deqp::sl::ShaderCase::dumpValues(ShaderCase *this,ValueBlock *valueBlock,int arrayNdx)

{
  pointer pVVar1;
  _Alloc_hider __s;
  DataType dataType;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  ostringstream *this_00;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  attribValues;
  ostringstream result;
  undefined1 auStack_3a8 [8];
  ulong local_3a0;
  uint local_398;
  float local_394;
  uint local_390;
  int local_38c;
  ulong local_388;
  ulong local_380;
  long *local_378;
  long local_370;
  long local_368 [2];
  ShaderCase *local_358;
  ValueBlock *local_350;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_348;
  undefined1 local_328 [376];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_348.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_388 = ((long)(valueBlock->values).
                     super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(valueBlock->values).
                     super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  local_38c = arrayNdx;
  local_358 = this;
  local_350 = valueBlock;
  if (0 < (int)(uint)local_388) {
    local_388 = (ulong)((uint)local_388 & 0x7fffffff);
    uVar9 = 0;
    do {
      pVVar1 = (local_350->values).
               super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __s._M_p = pVVar1[uVar9].valueName._M_dataplus._M_p;
      local_3a0 = (ulong)pVVar1[uVar9].dataType;
      iVar2 = glu::getDataTypeScalarSize(pVVar1[uVar9].dataType);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"    ",4);
      pVVar1 = pVVar1 + uVar9;
      uVar4 = (ulong)pVVar1->storageType;
      if (uVar4 < 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_328,&DAT_01b862f4 + *(int *)(&DAT_01b862f4 + uVar4 * 4),
                   *(long *)(&DAT_01b86300 + uVar4 * 8));
      }
      pcVar5 = glu::getDataTypeName((DataType)local_3a0);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)auStack_3a8 + (int)*(_func_int **)(local_328._0_8_ + -0x18) + 0x80);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ",1);
      if (__s._M_p == (char *)0x0) {
        std::ios::clear((int)auStack_3a8 + (int)*(_func_int **)(local_328._0_8_ + -0x18) + 0x80);
      }
      else {
        sVar6 = strlen(__s._M_p);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,__s._M_p,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,":",1);
      uVar4 = local_3a0;
      lVar13 = 3;
      if ((uint)local_3a0 < 0x24) {
        if ((0x77003801cU >> (local_3a0 & 0x3f) & 1) == 0) {
          if ((0x888004002U >> (local_3a0 & 0x3f) & 1) == 0) goto LAB_00dab791;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ",1);
          if (((DataType)local_3a0 < 0x23) &&
             (pcVar5 = " [ ", (0x77003801cU >> (uVar4 & 0x3f) & 1) != 0)) goto LAB_00dab428;
          goto LAB_00dab7a9;
        }
        pcVar5 = " [ ";
LAB_00dab428:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar5,lVar13);
      }
      else {
LAB_00dab791:
        pcVar5 = " [ ";
        if ((uint)local_3a0 - 0x24 < 3) goto LAB_00dab428;
LAB_00dab7a9:
        lVar13 = 1;
        pcVar5 = "\n";
        if ((int)local_3a0 - 5U < 9 || (int)local_3a0 - 0x12U < 9) goto LAB_00dab428;
      }
      dataType = (DataType)local_3a0;
      local_380 = uVar9;
      if ((((DataType)local_3a0 < TYPE_BOOL) && ((0x7f803c01eU >> (uVar4 & 0x3f) & 1) != 0)) ||
         ((DataType)local_3a0 - TYPE_BOOL < 4)) {
        if (0 < iVar2) {
          uVar12 = (DataType)local_3a0 - TYPE_FLOAT;
          local_394 = (float)((DataType)local_3a0 - TYPE_INT);
          local_398 = (DataType)local_3a0 - TYPE_BOOL;
          iVar10 = 0;
          do {
            iVar8 = 0;
            if (pVVar1->arrayLength != 1) {
              iVar8 = local_38c;
            }
            lVar13 = *(long *)&(pVVar1->elements).
                               super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                               ._M_impl.super__Vector_impl_data;
            pcVar5 = " , ";
            if (iVar10 == 0) {
              pcVar5 = ::glcts::fixed_sample_locations_values;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,(bool *)pcVar5 + 1,(ulong)((uint)(iVar10 != 0) * 2));
            lVar7 = (long)(iVar8 * iVar2 + iVar10);
            if (uVar12 < 4) {
              std::ostream::_M_insert<double>((double)*(float *)(lVar13 + lVar7 * 4));
            }
            else if ((uint)local_394 < 4) {
              std::ostream::operator<<(local_328,*(int *)(lVar13 + lVar7 * 4));
            }
            else if (local_398 < 4) {
              bVar14 = *(int *)(lVar13 + lVar7 * 4) == 0;
              pcVar5 = "false";
              if (!bVar14) {
                pcVar5 = "true";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,pcVar5,(ulong)bVar14 | 4);
            }
            iVar10 = iVar10 + 1;
          } while (iVar2 != iVar10);
        }
      }
      else if ((DataType)local_3a0 - TYPE_FLOAT_MAT2 < 9 ||
               (DataType)local_3a0 - TYPE_DOUBLE_MAT2 < 9) {
        local_390 = glu::getDataTypeMatrixNumRows((DataType)local_3a0);
        iVar10 = glu::getDataTypeMatrixNumColumns(dataType);
        if (0 < (int)local_390) {
          iVar8 = 0;
          uVar12 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"       [ ",9);
            local_398 = uVar12;
            if (0 < iVar10) {
              iVar11 = 0;
              do {
                iVar3 = 0;
                if (pVVar1->arrayLength != 1) {
                  iVar3 = local_38c;
                }
                local_394 = *(float *)(*(long *)&(pVVar1->elements).
                                                 super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                                                 ._M_impl.super__Vector_impl_data +
                                      (long)(iVar3 * iVar2 + iVar8 + iVar11) * 4);
                pcVar5 = " , ";
                if (iVar11 == 0) {
                  pcVar5 = ::glcts::fixed_sample_locations_values;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_328,(bool *)pcVar5 + 1,(ulong)((uint)(iVar11 != 0) * 2))
                ;
                std::ostream::_M_insert<double>((double)local_394);
                iVar11 = iVar11 + 1;
              } while (iVar10 != iVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ]\n",3);
            uVar12 = local_398 + 1;
            iVar8 = iVar8 + iVar10;
          } while (uVar12 != local_390);
        }
      }
      uVar9 = local_380;
      uVar12 = (int)local_3a0 - 1;
      if ((uVar12 < 0x23) && ((0x7fc01e00fU >> ((ulong)uVar12 & 0x3f) & 1) != 0)) {
        pcVar5 = &DAT_01b86318 + *(int *)(&DAT_01b86318 + (ulong)uVar12 * 4);
        lVar13 = *(long *)(&DAT_01b863a8 + (ulong)uVar12 * 8);
LAB_00dab5a9:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar5,lVar13);
      }
      else {
        lVar13 = 3;
        pcVar5 = " ]\n";
        if ((int)local_3a0 - 0x24U < 3) goto LAB_00dab5a9;
      }
      this_00 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = ((local_358->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(char *)local_378,local_370);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_378 != local_368) {
        operator_delete(local_378,local_368[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base((ios_base *)(local_328 + 0x70));
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_388);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_348);
  return;
}

Assistant:

void ShaderCase::dumpValues(const ValueBlock& valueBlock, int arrayNdx)
{
	vector<vector<float> > attribValues;

	int numValues = (int)valueBlock.values.size();
	for (int valNdx = 0; valNdx < numValues; valNdx++)
	{
		const ShaderCase::Value& val		= valueBlock.values[valNdx];
		const char*				 valueName  = val.valueName.c_str();
		DataType				 dataType   = val.dataType;
		int						 scalarSize = getDataTypeScalarSize(val.dataType);
		ostringstream			 result;

		result << "    ";
		if (val.storageType == Value::STORAGE_INPUT)
			result << "input ";
		else if (val.storageType == Value::STORAGE_UNIFORM)
			result << "uniform ";
		else if (val.storageType == Value::STORAGE_OUTPUT)
			result << "expected ";

		result << getDataTypeName(dataType) << " " << valueName << ":";

		if (isDataTypeScalar(dataType))
			result << " ";
		if (isDataTypeVector(dataType))
			result << " [ ";
		else if (isDataTypeMatrix(dataType))
			result << "\n";

		if (isDataTypeScalarOrVector(dataType))
		{
			for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
			{
				int					  elemNdx = (val.arrayLength == 1) ? 0 : arrayNdx;
				const Value::Element& e		  = val.elements[elemNdx * scalarSize + scalarNdx];
				result << ((scalarNdx != 0) ? ", " : "");

				if (isDataTypeFloatOrVec(dataType))
					result << e.float32;
				else if (isDataTypeIntOrIVec(dataType))
					result << e.int32;
				else if (isDataTypeBoolOrBVec(dataType))
					result << (e.bool32 ? "true" : "false");
			}
		}
		else if (isDataTypeMatrix(dataType))
		{
			int numRows = getDataTypeMatrixNumRows(dataType);
			int numCols = getDataTypeMatrixNumColumns(dataType);
			for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
			{
				result << "       [ ";
				for (int colNdx = 0; colNdx < numCols; colNdx++)
				{
					int   elemNdx = (val.arrayLength == 1) ? 0 : arrayNdx;
					float v		  = val.elements[elemNdx * scalarSize + rowNdx * numCols + colNdx].float32;
					result << ((colNdx == 0) ? "" : ", ") << v;
				}
				result << " ]\n";
			}
		}

		if (isDataTypeScalar(dataType))
			result << "\n";
		else if (isDataTypeVector(dataType))
			result << " ]\n";

		m_testCtx.getLog() << TestLog::Message << result.str() << TestLog::EndMessage;
	}
}